

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  int *piVar1;
  char *pcVar2;
  undefined8 *puVar3;
  IReporter **curr_rep;
  undefined8 *puVar4;
  long lVar5;
  long in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  double __x_00;
  undefined4 extraout_XMM0_Db;
  undefined4 local_38;
  undefined4 uStack_34;
  uint uStack_30;
  uint uStack_2c;
  undefined8 local_28;
  
  __x_00 = (double)CONCAT44(uStack_34,local_38);
  getTlsOssResult();
  if (((this->super_MessageData).m_string.field_0.buf[0x17] < '\0') &&
     (pcVar2 = (this->super_MessageData).m_string.field_0.data.ptr, pcVar2 != (char *)0x0)) {
    operator_delete__(pcVar2);
  }
  *(undefined8 *)((long)&(this->super_MessageData).m_string.field_0 + 0x10) = local_28;
  *(undefined4 *)&(this->super_MessageData).m_string.field_0 = local_38;
  *(undefined4 *)((long)&(this->super_MessageData).m_string.field_0 + 4) = uStack_34;
  (this->super_MessageData).m_string.field_0.data.size = uStack_30;
  (this->super_MessageData).m_string.field_0.data.capacity = uStack_2c;
  puVar3 = *(undefined8 **)(g_cs + 0x10d8);
  for (puVar4 = *(undefined8 **)(g_cs + 0x10d0); puVar4 != puVar3; puVar4 = puVar4 + 1) {
    __x_00 = (double)(**(code **)(*(long *)*puVar4 + 0x50))((long *)*puVar4,this);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    lVar5 = g_cs + 0xb8;
    if (*(char *)(in_FS_OFFSET + -8) == '\0') {
      __x_00 = log(__x_00);
    }
    LOCK();
    piVar1 = (int *)(lVar5 + *(long *)(in_FS_OFFSET + -0x10) * 0x40);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    if (((this->super_MessageData).m_severity & is_warn) == 0) {
      lVar5 = g_cs + 0x8b8;
      if (*(char *)(in_FS_OFFSET + -8) == '\0') {
        log(__x_00);
      }
      LOCK();
      piVar1 = (int *)(lVar5 + *(long *)(in_FS_OFFSET + -0x10) * 0x40);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  isDebuggerActive();
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

bool MessageBuilder::log() {
        m_string = getTlsOssResult();
        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }